

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall
restincurl::CurlException::CurlException(CurlException *this,string *msg,CURLcode err)

{
  char *__rhs;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_90,msg,'(');
  std::__cxx11::to_string(&local_b0,err);
  std::operator+(&local_70,&local_90,&local_b0);
  std::operator+(&local_50,&local_70,"): ");
  __rhs = (char *)curl_easy_strerror(err);
  std::operator+(&local_30,&local_50,__rhs);
  Exception::Exception(&this->super_Exception,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_00113c60;
  this->err_ = err;
  return;
}

Assistant:

CurlException(const std::string msg, const CURLcode err)
            : Exception(msg + '(' + std::to_string(err) + "): " + curl_easy_strerror(err))
            , err_{err}
            {}